

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O0

void __thiscall Help_Empty_Test::Help_Empty_Test(Help_Empty_Test *this)

{
  Help_Empty_Test *this_local;
  
  anon_unknown.dwarf_58649::Help::Help(&this->super_Help);
  (this->super_Help).super_Test._vptr_Test = (_func_int **)&PTR__Help_Empty_Test_00246a30;
  return;
}

Assistant:

TEST_F (Help, Empty) {
    string_stream output;
    string_stream errors;
    bool res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);
    EXPECT_EQ (output.str (), "OVERVIEW: overview\nUSAGE: program\n");
    EXPECT_EQ (errors.str (), "");
}